

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

compute_mul_parity_result
fmt::v9::detail::dragonbox::cache_accessor<float>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  compute_mul_parity_result cVar1;
  
  if (beta < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x161,"");
  }
  if ((uint)beta < 0x40) {
    cVar1.is_integer = (int)((ulong)two_f * *cache >> (-((char)beta + ' ') & 0x3fU)) == 0;
    cVar1.parity = ((ulong)two_f * *cache >> ((ulong)(byte)(0x40 - (char)beta) & 0x3f) & 1) != 0;
    return cVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
              ,0x162,"");
}

Assistant:

static compute_mul_parity_result compute_mul_parity(
      carrier_uint two_f, const cache_entry_type& cache, int beta) noexcept {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul96_lower64(two_f, cache);
    return {((r >> (64 - beta)) & 1) != 0,
            static_cast<uint32_t>(r >> (32 - beta)) == 0};
  }